

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memory.c
# Opt level: O3

MemoryRegionSection *
memory_region_find_sparc64
          (MemoryRegionSection *__return_storage_ptr__,MemoryRegion *mr,hwaddr addr,uint64_t size)

{
  FlatRange *pFVar1;
  AddrRange r1;
  AddrRange r2;
  AddrRange r2_00;
  MemoryRegion *pMVar2;
  _Bool _Var3;
  FlatRange *pFVar4;
  AddressSpace *pAVar5;
  MemoryRegion *pMVar6;
  FlatView *pFVar7;
  hwaddr hVar8;
  ulong uVar9;
  undefined8 in_stack_ffffffffffffff88;
  undefined8 in_stack_ffffffffffffff90;
  undefined8 in_stack_ffffffffffffff98;
  long lVar10;
  
  uVar9 = addr + mr->addr;
  pMVar6 = mr->container;
  while (pMVar2 = pMVar6, pMVar2 != (MemoryRegion *)0x0) {
    uVar9 = uVar9 + pMVar2->addr;
    mr = pMVar2;
    pMVar6 = pMVar2->container;
  }
  do {
    pMVar6 = mr;
    mr = pMVar6->container;
  } while (pMVar6->container != (MemoryRegion *)0x0);
  pAVar5 = (pMVar6->uc->address_spaces).tqh_first;
  do {
    if (pAVar5 == (AddressSpace *)0x0) {
LAB_00a0aa04:
      hVar8 = 0;
      pFVar7 = (FlatView *)0x0;
      pMVar6 = (MemoryRegion *)0x0;
      size = 0;
      uVar9 = 0;
      _Var3 = false;
LAB_00a0aa08:
      *(uint64_t *)&__return_storage_ptr__->size = size;
      *(undefined8 *)((long)&__return_storage_ptr__->size + 8) = 0;
      __return_storage_ptr__->mr = pMVar6;
      __return_storage_ptr__->fv = pFVar7;
      __return_storage_ptr__->offset_within_region = hVar8;
      __return_storage_ptr__->offset_within_address_space = uVar9;
      __return_storage_ptr__->readonly = _Var3;
      *(undefined8 *)&__return_storage_ptr__->field_0x31 = 0;
      *(undefined8 *)&__return_storage_ptr__->field_0x38 = 0;
      return __return_storage_ptr__;
    }
    if (pMVar6 == (MemoryRegion *)pAVar5->root) {
      pFVar7 = pAVar5->current_map;
      lVar10 = 0;
      pFVar4 = (FlatRange *)
               bsearch(&stack0xffffffffffffffa8,pFVar7->ranges,(ulong)pFVar7->nr,0x40,
                       cmp_flatrange_addr);
      if (pFVar4 != (FlatRange *)0x0) {
        pFVar1 = pFVar7->ranges;
        while ((pFVar1 < pFVar4 &&
               (r1.start._8_8_ = 0, r1.start._0_8_ = size, r1.size._0_8_ = in_stack_ffffffffffffff88
               , r1.size._8_8_ = in_stack_ffffffffffffff90, r2.start._8_8_ = pFVar7,
               r2.start._0_8_ = in_stack_ffffffffffffff98, r2.size._0_8_ = uVar9,
               r2.size._8_8_ = lVar10, _Var3 = addrrange_intersects(r1,r2), _Var3))) {
          pFVar4 = pFVar4 + -1;
        }
        pMVar6 = pFVar4->mr;
        r2_00.start._8_8_ = pFVar7;
        r2_00.start._0_8_ = in_stack_ffffffffffffff98;
        r2_00.size._0_8_ = uVar9;
        r2_00.size._8_8_ = lVar10;
        addrrange_intersection((AddrRange *)&stack0xffffffffffffffa8,pFVar4->addr,r2_00);
        if ((lVar10 - (ulong)(uVar9 < (ulong)(pFVar4->addr).start) !=
             *(long *)((long)&(pFVar4->addr).start + 8)) || (lVar10 != 0)) {
          __assert_fail("r == a",
                        "/workspace/llm4binary/github/license_c_cmakelists/AFLplusplus[P]unicornafl/unicorn/qemu/include/qemu/int128.h"
                        ,0x16,"uint64_t int128_get64(Int128)");
        }
        hVar8 = (uVar9 - (long)(pFVar4->addr).start) + pFVar4->offset_in_region;
        _Var3 = pFVar4->readonly;
        goto LAB_00a0aa08;
      }
      goto LAB_00a0aa04;
    }
    pAVar5 = (pAVar5->address_spaces_link).tqe_next;
  } while( true );
}

Assistant:

MemoryRegionSection memory_region_find(MemoryRegion *mr,
                                       hwaddr addr, uint64_t size)
{
    MemoryRegionSection ret;

    ret = memory_region_find_rcu(mr, addr, size);
    return ret;
}